

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  char *__rhs;
  string *in_RDI;
  char *xml_output_file_env;
  string *default_value_for_output_flag;
  string *__lhs;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  char *local_28;
  allocator local_a;
  undefined1 local_9;
  
  local_9 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_a);
  std::allocator<char>::~allocator((allocator<char> *)&local_a);
  __rhs = posix::GetEnv((char *)0x14c437);
  if (__rhs != (char *)0x0) {
    local_28 = __rhs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"xml:",&local_69);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::operator=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return __lhs;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (nullptr != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}